

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::write<char,fmt::v10::appender>
                   (appender out,basic_string_view<char> s,format_specs<char> *specs)

{
  string_view s_00;
  string_view s_01;
  basic_string_view<char> str;
  type tVar1;
  char *s_02;
  counting_iterator out_00;
  appender aVar2;
  int *in_RCX;
  buffer<char> *in_RDX;
  format_specs<char> *in_RSI;
  size_t width;
  bool is_debug;
  size_t size;
  char *data;
  char *in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  basic_string_view<char> local_88;
  size_t in_stack_ffffffffffffff90;
  counting_iterator in_stack_ffffffffffffff98;
  counting_iterator in_stack_ffffffffffffffa0;
  format_specs<char> *in_stack_ffffffffffffffb8;
  buffer<char> *in_stack_ffffffffffffffc0;
  format_specs<char> *specs_00;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> out_01;
  
  s_02 = basic_string_view<char>::data((basic_string_view<char> *)&stack0xffffffffffffffe0);
  out_00.count_ = basic_string_view<char>::size((basic_string_view<char> *)&stack0xffffffffffffffe0)
  ;
  specs_00 = in_RSI;
  out_01.container = in_RDX;
  if ((-1 < in_RCX[1]) &&
     (tVar1 = to_unsigned<int>(0), specs_00 = in_RSI, out_01.container = in_RDX,
     (anon_class_40_4_6b3cdfe0 *)(ulong)tVar1 < out_00.count_)) {
    to_unsigned<int>(0);
    s_01.size_ = in_stack_ffffffffffffffa0.count_;
    s_01.data_ = (char *)in_stack_ffffffffffffff98.count_;
    out_00.count_ = code_point_index(s_01,in_stack_ffffffffffffff90);
    in_stack_ffffffffffffffb8 = in_RSI;
    in_stack_ffffffffffffffc0 = in_RDX;
  }
  if (*in_RCX != 0) {
    if ((char)in_RCX[2] == '\x12') {
      counting_iterator::counting_iterator((counting_iterator *)&stack0xffffffffffffff98);
      str.size_ = (size_t)in_stack_ffffffffffffffc0;
      str.data_ = (char *)in_stack_ffffffffffffffb8;
      write_escaped_string<char,fmt::v10::detail::counting_iterator>(out_00,str);
      counting_iterator::count((counting_iterator *)&stack0xffffffffffffffa0);
    }
    else {
      basic_string_view<char>::basic_string_view(&local_88,s_02,out_00.count_);
      s_00.size_ = in_stack_ffffffffffffff70;
      s_00.data_ = in_stack_ffffffffffffff68;
      compute_width(s_00);
    }
  }
  aVar2 = write_padded<(fmt::v10::align::type)1,fmt::v10::appender,char,fmt::v10::detail::write<char,fmt::v10::appender>(fmt::v10::appender,fmt::v10::basic_string_view<char>,fmt::v10::format_specs<char>const&)::_lambda(fmt::v10::appender)_1_>
                    ((appender)out_01.container,specs_00,(size_t)in_RCX,(size_t)s_02,
                     (anon_class_40_4_6b3cdfe0 *)out_00.count_);
  return (appender)
         aVar2.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, basic_string_view<Char> s,
                         const format_specs<Char>& specs) -> OutputIt {
  auto data = s.data();
  auto size = s.size();
  if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
    size = code_point_index(s, to_unsigned(specs.precision));
  bool is_debug = specs.type == presentation_type::debug;
  size_t width = 0;
  if (specs.width != 0) {
    if (is_debug)
      width = write_escaped_string(counting_iterator{}, s).count();
    else
      width = compute_width(basic_string_view<Char>(data, size));
  }
  return write_padded(out, specs, size, width,
                      [=](reserve_iterator<OutputIt> it) {
                        if (is_debug) return write_escaped_string(it, s);
                        return copy_str<Char>(data, data + size, it);
                      });
}